

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_tame(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  __type_conflict2 _Var4;
  int chance;
  char arg [4608];
  CHAR_DATA *victim;
  undefined7 in_stack_ffffffffffffedc8;
  undefined1 in_stack_ffffffffffffedcf;
  CHAR_DATA *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffede0;
  char local_1218;
  int in_stack_ffffffffffffeea4;
  undefined1 in_stack_ffffffffffffeeab;
  int in_stack_ffffffffffffeeac;
  CHAR_DATA *in_stack_ffffffffffffeeb0;
  int in_stack_ffffffffffffeecc;
  CHAR_DATA *in_stack_ffffffffffffeed0;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  CHAR_DATA *local_18;
  
  iVar2 = get_skill(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeecc);
  one_argument((char *)in_stack_ffffffffffffedd0,
               (char *)CONCAT17(in_stack_ffffffffffffedcf,in_stack_ffffffffffffedc8));
  if (local_1218 == '\0') {
    local_18 = *(CHAR_DATA **)(in_RDI + 0x20);
  }
  else {
    local_18 = get_char_room(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  if (local_18 == (CHAR_DATA *)0x0) {
    send_to_char((char *)CONCAT44(iVar2,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8);
  }
  else {
    bVar1 = is_npc((CHAR_DATA *)CONCAT17(in_stack_ffffffffffffedcf,in_stack_ffffffffffffedc8));
    if (bVar1) {
      ch_00 = (CHAR_DATA *)local_18->act[0];
      _Var4 = std::pow<int,int>(0,0x5ece7f);
      if (((ulong)ch_00 & (long)_Var4) == 0) {
        in_stack_ffffffffffffedd0 = (CHAR_DATA *)local_18->off_flags[0];
        _Var4 = std::pow<int,int>(0,0x5eceb5);
        if (((ulong)in_stack_ffffffffffffedd0 & (long)_Var4) == 0) {
          send_to_char((char *)CONCAT44(iVar2,in_stack_ffffffffffffede0),ch_00);
          return;
        }
      }
      iVar2 = ((int)*(short *)(in_RDI + 0x138) - (int)local_18->level) * 3 + iVar2;
      if (0x5a < iVar2) {
        iVar2 = 0x5a;
      }
      WAIT_STATE((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffede0),(int)((ulong)ch_00 >> 0x20))
      ;
      iVar3 = number_percent();
      if (iVar2 < iVar3) {
        act((char *)CONCAT44(iVar2,in_stack_ffffffffffffede0),ch_00,in_stack_ffffffffffffedd0,
            (void *)CONCAT17(in_stack_ffffffffffffedcf,in_stack_ffffffffffffedc8),0);
        act((char *)CONCAT44(iVar2,in_stack_ffffffffffffede0),ch_00,in_stack_ffffffffffffedd0,
            (void *)CONCAT17(in_stack_ffffffffffffedcf,in_stack_ffffffffffffedc8),0);
        act((char *)CONCAT44(iVar2,in_stack_ffffffffffffede0),ch_00,in_stack_ffffffffffffedd0,
            (void *)CONCAT17(in_stack_ffffffffffffedcf,in_stack_ffffffffffffedc8),0);
        check_improve(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
                      (bool)in_stack_ffffffffffffeeab,in_stack_ffffffffffffeea4);
      }
      else {
        act((char *)CONCAT44(iVar2,in_stack_ffffffffffffede0),ch_00,in_stack_ffffffffffffedd0,
            (void *)CONCAT17(in_stack_ffffffffffffedcf,in_stack_ffffffffffffedc8),0);
        act((char *)CONCAT44(iVar2,in_stack_ffffffffffffede0),ch_00,in_stack_ffffffffffffedd0,
            (void *)CONCAT17(in_stack_ffffffffffffedcf,in_stack_ffffffffffffedc8),0);
        act((char *)CONCAT44(iVar2,in_stack_ffffffffffffede0),ch_00,in_stack_ffffffffffffedd0,
            (void *)CONCAT17(in_stack_ffffffffffffedcf,in_stack_ffffffffffffedc8),0);
        check_improve(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
                      (bool)in_stack_ffffffffffffeeab,in_stack_ffffffffffffeea4);
        stop_fighting(in_stack_ffffffffffffedd0,(bool)in_stack_ffffffffffffedcf);
        local_18->last_fought = (CHAR_DATA *)0x0;
        _Var4 = std::pow<int,int>(0,0x5ed097);
        local_18->act[0] = ((long)_Var4 ^ 0xffffffffffffffffU) & local_18->act[0];
        _Var4 = std::pow<int,int>(0,0x5ed0c5);
        local_18->off_flags[0] = ((long)_Var4 ^ 0xffffffffffffffffU) & local_18->off_flags[0];
      }
    }
    else {
      send_to_char((char *)CONCAT44(iVar2,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8);
    }
  }
  return;
}

Assistant:

void do_tame(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	int chance;

	chance = get_skill(ch, gsn_tame);
	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch->fighting;
	else
		victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here to tame though.\n\r", ch);
		return;
	}

	if (!is_npc(victim))
	{
		send_to_char("Why not just talk to them about your problems?\n\r", ch);
		return;
	}
	else if (!IS_SET(victim->act, ACT_AGGRESSIVE) && !IS_SET(victim->off_flags, SPAM_MURDER))
	{
		send_to_char("They are as tame as they can be.\n\r", ch);
		return;
	}

	chance += (ch->level - victim->level) * 3;

	if (chance > 90)
		chance = 90;

	WAIT_STATE(ch, 12);

	if (number_percent() > chance)
	{
		act("$n tries to calm down $N but fails.", ch, 0, victim, TO_NOTVICT);
		act("$n tries to calm you down but fails.", ch, 0, victim, TO_VICT);
		act("You try to calm $N down but fail.", ch, 0, victim, TO_CHAR);
		check_improve(ch, gsn_tame, false, 2);
		return;
	}

	act("$n calms $N down.", ch, 0, victim, TO_NOTVICT);
	act("You calm $N down.", ch, 0, victim, TO_CHAR);
	act("$n calms you down.", ch, 0, victim, TO_VICT);

	check_improve(ch, gsn_tame, true, 2);
	stop_fighting(victim, true);
	victim->last_fought = nullptr;

	REMOVE_BIT(victim->act, ACT_AGGRESSIVE);
	REMOVE_BIT(victim->off_flags, SPAM_MURDER);
}